

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O0

void fill_window(deflate_state *s)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  Posf local_30;
  Posf local_2c;
  uint local_24;
  uInt wsize;
  uint more;
  Posf *p;
  uint m;
  uint n;
  deflate_state *s_local;
  
  uVar1 = s->w_size;
  while( true ) {
    local_24 = ((int)s->window_size - s->lookahead) - s->strstart;
    if (uVar1 + (s->w_size - 0x106) <= s->strstart) {
      memcpy(s->window,s->window + uVar1,(ulong)uVar1);
      s->match_start = s->match_start - uVar1;
      s->strstart = s->strstart - uVar1;
      s->block_start = s->block_start - (ulong)uVar1;
      p._4_4_ = s->hash_size;
      _wsize = s->head + p._4_4_;
      do {
        if (_wsize[-1] < uVar1) {
          local_2c = 0;
        }
        else {
          local_2c = _wsize[-1] - (short)uVar1;
        }
        _wsize[-1] = local_2c;
        p._4_4_ = p._4_4_ - 1;
        _wsize = _wsize + -1;
      } while (p._4_4_ != 0);
      _wsize = s->prev + uVar1;
      p._4_4_ = uVar1;
      do {
        if (_wsize[-1] < uVar1) {
          local_30 = 0;
        }
        else {
          local_30 = _wsize[-1] - (short)uVar1;
        }
        _wsize[-1] = local_30;
        p._4_4_ = p._4_4_ - 1;
        _wsize = _wsize + -1;
      } while (p._4_4_ != 0);
      local_24 = uVar1 + local_24;
    }
    if (s->strm->avail_in == 0) break;
    iVar2 = read_buf(s->strm,s->window + (ulong)s->lookahead + (ulong)s->strstart,local_24);
    s->lookahead = iVar2 + s->lookahead;
    if (2 < s->lookahead) {
      s->ins_h = (uint)s->window[s->strstart];
      s->ins_h = (s->ins_h << ((byte)s->hash_shift & 0x1f) ^ (uint)s->window[s->strstart + 1]) &
                 s->hash_mask;
    }
    bVar3 = false;
    if (s->lookahead < 0x106) {
      bVar3 = s->strm->avail_in != 0;
    }
    if (!bVar3) {
      return;
    }
  }
  return;
}

Assistant:

static lzma_ret
fill_window(lzma_coder *coder, const lzma_allocator *allocator,
		const uint8_t *in, size_t *in_pos, size_t in_size,
		lzma_action action)
{
	assert(coder->mf.read_pos <= coder->mf.write_pos);

	// Move the sliding window if needed.
	if (coder->mf.read_pos >= coder->mf.size - coder->mf.keep_size_after)
		move_window(&coder->mf);

	// Maybe this is ugly, but lzma_mf uses uint32_t for most things
	// (which I find cleanest), but we need size_t here when filling
	// the history window.
	size_t write_pos = coder->mf.write_pos;
	lzma_ret ret;
	if (coder->next.code == NULL) {
		// Not using a filter, simply memcpy() as much as possible.
		lzma_bufcpy(in, in_pos, in_size, coder->mf.buffer,
				&write_pos, coder->mf.size);

		ret = action != LZMA_RUN && *in_pos == in_size
				? LZMA_STREAM_END : LZMA_OK;

	} else {
		ret = coder->next.code(coder->next.coder, allocator,
				in, in_pos, in_size,
				coder->mf.buffer, &write_pos,
				coder->mf.size, action);
	}

	coder->mf.write_pos = write_pos;

	// Silence Valgrind. lzma_memcmplen() can read extra bytes
	// and Valgrind will give warnings if those bytes are uninitialized
	// because Valgrind cannot see that the values of the uninitialized
	// bytes are eventually ignored.
	memzero(coder->mf.buffer + write_pos, LZMA_MEMCMPLEN_EXTRA);

	// If end of stream has been reached or flushing completed, we allow
	// the encoder to process all the input (that is, read_pos is allowed
	// to reach write_pos). Otherwise we keep keep_size_after bytes
	// available as prebuffer.
	if (ret == LZMA_STREAM_END) {
		assert(*in_pos == in_size);
		ret = LZMA_OK;
		coder->mf.action = action;
		coder->mf.read_limit = coder->mf.write_pos;

	} else if (coder->mf.write_pos > coder->mf.keep_size_after) {
		// This needs to be done conditionally, because if we got
		// only little new input, there may be too little input
		// to do any encoding yet.
		coder->mf.read_limit = coder->mf.write_pos
				- coder->mf.keep_size_after;
	}

	// Restart the match finder after finished LZMA_SYNC_FLUSH.
	if (coder->mf.pending > 0
			&& coder->mf.read_pos < coder->mf.read_limit) {
		// Match finder may update coder->pending and expects it to
		// start from zero, so use a temporary variable.
		const uint32_t pending = coder->mf.pending;
		coder->mf.pending = 0;

		// Rewind read_pos so that the match finder can hash
		// the pending bytes.
		assert(coder->mf.read_pos >= pending);
		coder->mf.read_pos -= pending;

		// Call the skip function directly instead of using
		// mf_skip(), since we don't want to touch mf->read_ahead.
		coder->mf.skip(&coder->mf, pending);
	}

	return ret;
}